

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslGrammar.cpp
# Opt level: O3

bool __thiscall
glslang::HlslGrammar::acceptIterationStatement
          (HlslGrammar *this,TIntermNode **statement,TAttributes *attributes)

{
  HlslToken *pHVar1;
  int *piVar2;
  bool bVar3;
  EHlslTokenClass EVar4;
  TIntermAggregate *pTVar5;
  char *pcVar6;
  TIntermNode *body;
  TIntermediate *this_00;
  HlslParseContext *pHVar7;
  _func_int **pp_Var8;
  TIntermTyped *condition;
  TIntermLoop *loopNode;
  TSourceLoc loc;
  TIntermTyped *iterator;
  TIntermNode *initNode;
  
  loc.column = (this->super_HlslTokenStream).token.loc.column;
  loc._20_4_ = *(undefined4 *)&(this->super_HlslTokenStream).token.loc.field_0x14;
  loc.name = (this->super_HlslTokenStream).token.loc.name;
  loc.string = (this->super_HlslTokenStream).token.loc.string;
  loc.line = (this->super_HlslTokenStream).token.loc.line;
  condition = (TIntermTyped *)0x0;
  EVar4 = HlslTokenStream::peek(&this->super_HlslTokenStream);
  if (2 < EVar4 - EHTokFor) {
    __assert_fail("loop == EHTokDo || loop == EHTokFor || loop == EHTokWhile",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/HLSL/hlslGrammar.cpp"
                  ,0xfb9,
                  "bool glslang::HlslGrammar::acceptIterationStatement(TIntermNode *&, const TAttributes &)"
                 );
  }
  pHVar1 = &(this->super_HlslTokenStream).token;
  HlslTokenStream::advanceToken(&this->super_HlslTokenStream);
  loopNode = (TIntermLoop *)0x0;
  if (EVar4 == EHTokFor) {
    bVar3 = HlslTokenStream::acceptTokenClass(&this->super_HlslTokenStream,EHTokLeftParen);
    if (!bVar3) {
      (*(this->parseContext->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions
        [0x2d])(this->parseContext,pHVar1,"Expected","(","");
    }
    TSymbolTable::push((this->parseContext->super_TParseContextBase).symbolTable);
    initNode = (TIntermNode *)0x0;
    bVar3 = acceptSimpleStatement(this,&initNode);
    if (!bVar3) {
      (*(this->parseContext->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions
        [0x2d])(this->parseContext,pHVar1,"Expected","for-loop initializer statement","");
    }
    pHVar7 = this->parseContext;
    piVar2 = &(pHVar7->super_TParseContextBase).loopNestingLevel;
    *piVar2 = *piVar2 + 1;
    piVar2 = &(pHVar7->super_TParseContextBase).controlFlowNestingLevel;
    *piVar2 = *piVar2 + 1;
    acceptExpression(this,&condition);
    bVar3 = HlslTokenStream::acceptTokenClass(&this->super_HlslTokenStream,EHTokSemicolon);
    if (!bVar3) {
      (*(this->parseContext->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions
        [0x2d])(this->parseContext,pHVar1,"Expected",";","");
    }
    if ((condition != (TIntermTyped *)0x0) &&
       (condition = HlslParseContext::convertConditionalExpression
                              (this->parseContext,&loc,condition,true),
       condition == (TIntermTyped *)0x0)) {
      return false;
    }
    iterator = (TIntermTyped *)0x0;
    acceptExpression(this,&iterator);
    bVar3 = HlslTokenStream::acceptTokenClass(&this->super_HlslTokenStream,EHTokRightParen);
    if (!bVar3) {
      (*(this->parseContext->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions
        [0x2d])(this->parseContext,pHVar1,"Expected",")","");
    }
    bVar3 = acceptScopedStatement(this,statement);
    if (!bVar3) {
      pHVar7 = this->parseContext;
      pp_Var8 = (pHVar7->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
      pcVar6 = "for sub-statement";
      goto LAB_003a5f88;
    }
    pTVar5 = TIntermediate::addForLoop
                       (this->intermediate,*statement,initNode,condition,iterator,true,&loc,
                        &loopNode);
    *statement = (TIntermNode *)pTVar5;
    TSymbolTable::pop((this->parseContext->super_TParseContextBase).symbolTable,
                      (TPrecisionQualifier *)0x0);
    pHVar7 = this->parseContext;
    piVar2 = &(pHVar7->super_TParseContextBase).loopNestingLevel;
    *piVar2 = *piVar2 + -1;
    piVar2 = &(pHVar7->super_TParseContextBase).controlFlowNestingLevel;
    *piVar2 = *piVar2 + -1;
  }
  else {
    if (EVar4 == EHTokDo) {
      pHVar7 = this->parseContext;
      piVar2 = &(pHVar7->super_TParseContextBase).loopNestingLevel;
      *piVar2 = *piVar2 + 1;
      piVar2 = &(pHVar7->super_TParseContextBase).controlFlowNestingLevel;
      *piVar2 = *piVar2 + 1;
      bVar3 = acceptScopedStatement(this,statement);
      if (!bVar3) {
        pHVar7 = this->parseContext;
        pp_Var8 = (pHVar7->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
        pcVar6 = "do sub-statement";
LAB_003a5f88:
        (*pp_Var8[0x2d])(pHVar7,pHVar1,"Expected",pcVar6,"");
        return false;
      }
      bVar3 = HlslTokenStream::acceptTokenClass(&this->super_HlslTokenStream,EHTokWhile);
      if (!bVar3) {
        pHVar7 = this->parseContext;
        pp_Var8 = (pHVar7->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
        pcVar6 = "while";
        goto LAB_003a5f88;
      }
      bVar3 = acceptParenExpression(this,&condition);
      if (!bVar3) {
        return false;
      }
      condition = HlslParseContext::convertConditionalExpression
                            (this->parseContext,&loc,condition,true);
      if (condition == (TIntermTyped *)0x0) {
        return false;
      }
      bVar3 = HlslTokenStream::acceptTokenClass(&this->super_HlslTokenStream,EHTokSemicolon);
      if (!bVar3) {
        (*(this->parseContext->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions
          [0x2d])(this->parseContext,pHVar1,"Expected");
      }
      pHVar7 = this->parseContext;
      piVar2 = &(pHVar7->super_TParseContextBase).loopNestingLevel;
      *piVar2 = *piVar2 + -1;
      piVar2 = &(pHVar7->super_TParseContextBase).controlFlowNestingLevel;
      *piVar2 = *piVar2 + -1;
      this_00 = this->intermediate;
      body = *statement;
      bVar3 = false;
    }
    else {
      TSymbolTable::push((this->parseContext->super_TParseContextBase).symbolTable);
      pHVar7 = this->parseContext;
      piVar2 = &(pHVar7->super_TParseContextBase).loopNestingLevel;
      *piVar2 = *piVar2 + 1;
      piVar2 = &(pHVar7->super_TParseContextBase).controlFlowNestingLevel;
      *piVar2 = *piVar2 + 1;
      bVar3 = acceptParenExpression(this,&condition);
      if (!bVar3) {
        return false;
      }
      condition = HlslParseContext::convertConditionalExpression
                            (this->parseContext,&loc,condition,true);
      if (condition == (TIntermTyped *)0x0) {
        return false;
      }
      bVar3 = acceptScopedStatement(this,statement);
      pHVar7 = this->parseContext;
      if (!bVar3) {
        pp_Var8 = (pHVar7->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
        pcVar6 = "while sub-statement";
        goto LAB_003a5f88;
      }
      piVar2 = &(pHVar7->super_TParseContextBase).loopNestingLevel;
      *piVar2 = *piVar2 + -1;
      TSymbolTable::pop((pHVar7->super_TParseContextBase).symbolTable,(TPrecisionQualifier *)0x0);
      piVar2 = &(this->parseContext->super_TParseContextBase).controlFlowNestingLevel;
      *piVar2 = *piVar2 + -1;
      this_00 = this->intermediate;
      body = *statement;
      bVar3 = true;
    }
    loopNode = TIntermediate::addLoop(this_00,body,condition,(TIntermTyped *)0x0,bVar3,&loc);
    *statement = &loopNode->super_TIntermNode;
  }
  HlslParseContext::handleLoopAttributes(this->parseContext,&loc,loopNode,attributes);
  return true;
}

Assistant:

bool HlslGrammar::acceptIterationStatement(TIntermNode*& statement, const TAttributes& attributes)
{
    TSourceLoc loc = token.loc;
    TIntermTyped* condition = nullptr;

    EHlslTokenClass loop = peek();
    assert(loop == EHTokDo || loop == EHTokFor || loop == EHTokWhile);

    //  WHILE or DO or FOR
    advanceToken();

    TIntermLoop* loopNode = nullptr;
    switch (loop) {
    case EHTokWhile:
        // so that something declared in the condition is scoped to the lifetime
        // of the while sub-statement
        parseContext.pushScope();  // this only needs to work right if no errors
        parseContext.nestLooping();
        ++parseContext.controlFlowNestingLevel;

        // LEFT_PAREN condition RIGHT_PAREN
        if (! acceptParenExpression(condition))
            return false;
        condition = parseContext.convertConditionalExpression(loc, condition);
        if (condition == nullptr)
            return false;

        // statement
        if (! acceptScopedStatement(statement)) {
            expected("while sub-statement");
            return false;
        }

        parseContext.unnestLooping();
        parseContext.popScope();
        --parseContext.controlFlowNestingLevel;

        loopNode = intermediate.addLoop(statement, condition, nullptr, true, loc);
        statement = loopNode;
        break;

    case EHTokDo:
        parseContext.nestLooping();  // this only needs to work right if no errors
        ++parseContext.controlFlowNestingLevel;

        // statement
        if (! acceptScopedStatement(statement)) {
            expected("do sub-statement");
            return false;
        }

        // WHILE
        if (! acceptTokenClass(EHTokWhile)) {
            expected("while");
            return false;
        }

        // LEFT_PAREN condition RIGHT_PAREN
        if (! acceptParenExpression(condition))
            return false;
        condition = parseContext.convertConditionalExpression(loc, condition);
        if (condition == nullptr)
            return false;

        if (! acceptTokenClass(EHTokSemicolon))
            expected(";");

        parseContext.unnestLooping();
        --parseContext.controlFlowNestingLevel;

        loopNode = intermediate.addLoop(statement, condition, nullptr, false, loc);
        statement = loopNode;
        break;

    case EHTokFor:
    {
        // LEFT_PAREN
        if (! acceptTokenClass(EHTokLeftParen))
            expected("(");

        // so that something declared in the condition is scoped to the lifetime
        // of the for sub-statement
        parseContext.pushScope();

        // initializer
        TIntermNode* initNode = nullptr;
        if (! acceptSimpleStatement(initNode))
            expected("for-loop initializer statement");

        parseContext.nestLooping();  // this only needs to work right if no errors
        ++parseContext.controlFlowNestingLevel;

        // condition SEMI_COLON
        acceptExpression(condition);
        if (! acceptTokenClass(EHTokSemicolon))
            expected(";");
        if (condition != nullptr) {
            condition = parseContext.convertConditionalExpression(loc, condition);
            if (condition == nullptr)
                return false;
        }

        // iterator SEMI_COLON
        TIntermTyped* iterator = nullptr;
        acceptExpression(iterator);
        if (! acceptTokenClass(EHTokRightParen))
            expected(")");

        // statement
        if (! acceptScopedStatement(statement)) {
            expected("for sub-statement");
            return false;
        }

        statement = intermediate.addForLoop(statement, initNode, condition, iterator, true, loc, loopNode);

        parseContext.popScope();
        parseContext.unnestLooping();
        --parseContext.controlFlowNestingLevel;

        break;
    }

    default:
        return false;
    }

    parseContext.handleLoopAttributes(loc, loopNode, attributes);
    return true;
}